

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark
          (AutoSetupRecyclerForNonCollectingMark *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  
  if (this->m_setupDone == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f27,"(m_setupDone)","m_setupDone");
    if (!bVar2) goto LAB_00688d9f;
    *puVar3 = 0;
  }
  pRVar4 = this->m_recycler;
  if (pRVar4->allowAllocationDuringHeapEnum == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f28,"(!m_recycler.allowAllocationDuringHeapEnum)",
                       "!m_recycler.allowAllocationDuringHeapEnum");
    if (!bVar2) {
LAB_00688d9f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pRVar4 = this->m_recycler;
  }
  memcpy(&pRVar4->collectionStats,&this->m_previousCollectionStats,0x538);
  ObservableValue<Memory::CollectionState>::SetValue
            (&this->m_recycler->collectionState,this->m_previousCollectionState);
  pRVar4 = this->m_recycler;
  pRVar4->isHeapEnumInProgress = false;
  pRVar4->isCollectionDisabled = false;
  return;
}

Assistant:

Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark()
{
    Assert(m_setupDone);
    Assert(!m_recycler.allowAllocationDuringHeapEnum);
#ifdef RECYCLER_STATS
    m_recycler.collectionStats = m_previousCollectionStats;
#endif
    m_recycler.SetCollectionState(m_previousCollectionState);
    m_recycler.isHeapEnumInProgress = false;
    m_recycler.isCollectionDisabled = false;
}